

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int select_dispatch(event_base *base,timeval *tv)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  size_t sz;
  fd_set *writeset_out;
  fd_set *readset_out;
  selectop *sop;
  int nfds;
  int j;
  int i;
  int res;
  timeval *tv_local;
  event_base *base_local;
  
  piVar4 = (int *)base->evbase;
  if (piVar4[2] != 0) {
    iVar1 = piVar4[1];
    pvVar3 = event_mm_realloc_(*(void **)(piVar4 + 8),(long)iVar1);
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    *(void **)(piVar4 + 8) = pvVar3;
    pvVar3 = event_mm_realloc_(*(void **)(piVar4 + 10),(long)iVar1);
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    *(void **)(piVar4 + 10) = pvVar3;
    piVar4[2] = 0;
  }
  memcpy(*(void **)(piVar4 + 8),*(void **)(piVar4 + 4),(long)piVar4[1]);
  memcpy(*(void **)(piVar4 + 10),*(void **)(piVar4 + 6),(long)piVar4[1]);
  iVar1 = *piVar4 + 1;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar2 = select(iVar1,*(fd_set **)(piVar4 + 8),*(fd_set **)(piVar4 + 10),(fd_set *)0x0,
                 (timeval *)tv);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar2 == 0xffffffff) {
    piVar4 = __errno_location();
    if (*piVar4 == 4) {
      base_local._4_4_ = 0;
    }
    else {
      event_warn("select");
      base_local._4_4_ = -1;
    }
  }
  else {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: select reports %d","select_dispatch",(ulong)uVar2);
    }
    nfds = evutil_weakrand_range_(&base->weakrand_seed,iVar1);
    for (sop._4_4_ = 0; sop._4_4_ < iVar1; sop._4_4_ = sop._4_4_ + 1) {
      nfds = nfds + 1;
      if (iVar1 <= nfds) {
        nfds = 0;
      }
      j = 0;
      if ((*(ulong *)(*(long *)(piVar4 + 8) + (long)(nfds / 0x40) * 8) &
          1L << ((byte)((long)nfds % 0x40) & 0x3f)) != 0) {
        j = 2;
      }
      if ((*(ulong *)(*(long *)(piVar4 + 10) + (long)(nfds / 0x40) * 8) &
          1L << ((byte)((long)nfds % 0x40) & 0x3f)) != 0) {
        j = j | 4;
      }
      if (j != 0) {
        evmap_io_active_(base,nfds,(short)j);
      }
    }
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

static int
select_dispatch(struct event_base *base, struct timeval *tv)
{
	int res=0, i, j, nfds;
	struct selectop *sop = base->evbase;

	check_selectop(sop);
	if (sop->resize_out_sets) {
		fd_set *readset_out=NULL, *writeset_out=NULL;
		size_t sz = sop->event_fdsz;
		if (!(readset_out = mm_realloc(sop->event_readset_out, sz)))
			return (-1);
		sop->event_readset_out = readset_out;
		if (!(writeset_out = mm_realloc(sop->event_writeset_out, sz))) {
			/* We don't free readset_out here, since it was
			 * already successfully reallocated. The next time
			 * we call select_dispatch, the realloc will be a
			 * no-op. */
			return (-1);
		}
		sop->event_writeset_out = writeset_out;
		sop->resize_out_sets = 0;
	}

	memcpy(sop->event_readset_out, sop->event_readset_in,
	       sop->event_fdsz);
	memcpy(sop->event_writeset_out, sop->event_writeset_in,
	       sop->event_fdsz);

	nfds = sop->event_fds+1;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = select(nfds, sop->event_readset_out,
	    sop->event_writeset_out, NULL, tv);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	check_selectop(sop);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("select");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: select reports %d", __func__, res));

	check_selectop(sop);
	i = evutil_weakrand_range_(&base->weakrand_seed, nfds);
	for (j = 0; j < nfds; ++j) {
		if (++i >= nfds)
			i = 0;
		res = 0;
		if (FD_ISSET(i, sop->event_readset_out))
			res |= EV_READ;
		if (FD_ISSET(i, sop->event_writeset_out))
			res |= EV_WRITE;

		if (res == 0)
			continue;

		evmap_io_active_(base, i, res);
	}
	check_selectop(sop);

	return (0);
}